

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseRunner.hpp
# Opt level: O0

void __thiscall Centaurus::BaseRunner::_start<Centaurus::Stage1Runner>(BaseRunner *this)

{
  clock_t end_time;
  pthread_attr_t attr;
  pthread_t thread;
  clock_t start_time;
  BaseRunner *this_local;
  
  start_time = (clock_t)this;
  thread = clock();
  pthread_attr_init((pthread_attr_t *)&end_time);
  pthread_attr_setstacksize((pthread_attr_t *)&end_time,0x40000000);
  pthread_create(&this->m_thread,(pthread_attr_t *)&end_time,thread_runner<Centaurus::Stage1Runner>,
                 this);
  clock();
  return;
}

Assistant:

void _start()
    {
        clock_t start_time = clock();

#if defined(CENTAURUS_BUILD_WINDOWS)
        m_thread = CreateThread(NULL, STACK_SIZE, BaseRunner::thread_runner<RunnerImpl>, this, STACK_SIZE_PARAM_IS_A_RESERVATION, NULL);
#elif defined(CENTAURUS_BUILD_LINUX)
        pthread_t thread;
        pthread_attr_t attr;

        pthread_attr_init(&attr);

        pthread_attr_setstacksize(&attr, STACK_SIZE);

        pthread_create(&m_thread, &attr, BaseRunner::thread_runner<RunnerImpl>, this);
#endif

        clock_t end_time = clock();

        //char buf[64];
        //snprintf(buf, 64, "Elapsed time = %lf[ms]\r\n", (double)(end_time - start_time) * 1000.0 / CLOCKS_PER_SEC);
        //Logger::WriteMessage(buf);
    }